

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O2

char * google::protobuf::internal::
       ReadPackedVarintArray<google::protobuf::internal::WireFormat::_InternalParseAndMergeField(google::protobuf::Message*,char_const*,google::protobuf::internal::ParseContext*,unsigned_long,google::protobuf::Reflection_const*,google::protobuf::FieldDescriptor_const*)::__0>
                 (char *ptr,char *end,anon_class_32_4_91646d40 add)

{
  int number;
  unsigned_long uVar1;
  EnumDescriptor *this;
  EnumValueDescriptor *pEVar2;
  UnknownFieldSet *this_00;
  int number_00;
  unsigned_long local_38;
  
  while( true ) {
    if (end <= ptr) {
      return ptr;
    }
    ptr = VarintParse<unsigned_long>(ptr,&local_38);
    uVar1 = local_38;
    if (ptr == (char *)0x0) break;
    this = FieldDescriptor::enum_type(add.field);
    number_00 = (int)uVar1;
    pEVar2 = EnumDescriptor::FindValueByNumber(this,number_00);
    if (pEVar2 == (EnumValueDescriptor *)0x0) {
      number = (add.field)->number_;
      this_00 = Reflection::MutableUnknownFields(add.reflection,add.msg);
      UnknownFieldSet::AddVarint(this_00,number,(long)number_00);
    }
    else {
      RepeatedField<int>::Add(add.rep_enum,number_00);
    }
  }
  return (char *)0x0;
}

Assistant:

const char* ReadPackedVarintArray(const char* ptr, const char* end, Add add) {
  while (ptr < end) {
    uint64_t varint;
    ptr = VarintParse(ptr, &varint);
    if (ptr == nullptr) return nullptr;
    add(varint);
  }
  return ptr;
}